

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O2

void DrawLineStrip(Vector2 *points,int pointsCount,Color color)

{
  ulong uVar1;
  
  if (1 < pointsCount) {
    rlCheckRenderBatchLimit(pointsCount);
    rlBegin(1);
    rlColor4ub(color.r,color.g,color.b,color.a);
    for (uVar1 = 0; pointsCount - 1 != uVar1; uVar1 = uVar1 + 1) {
      rlVertex2f(points[uVar1].x,points[uVar1].y);
      rlVertex2f(points[uVar1 + 1].x,points[uVar1 + 1].y);
    }
    rlEnd();
    return;
  }
  return;
}

Assistant:

void DrawLineStrip(Vector2 *points, int pointsCount, Color color)
{
    if (pointsCount >= 2)
    {
        rlCheckRenderBatchLimit(pointsCount);

        rlBegin(RL_LINES);
            rlColor4ub(color.r, color.g, color.b, color.a);

            for (int i = 0; i < pointsCount - 1; i++)
            {
                rlVertex2f(points[i].x, points[i].y);
                rlVertex2f(points[i + 1].x, points[i + 1].y);
            }
        rlEnd();
    }
}